

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<short,_unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase1
               (unsigned_short lhs,
               SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDX;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_SI;
  ushort in_DI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  short in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  short local_12;
  
  sVar2 = ::SafeInt::operator_cast_to_short
                    ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT26(in_stack_ffffffffffffffe6,
                                 CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
  if (sVar2 < 1) {
    sVar2 = ::SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffffe6,
                                   CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
    if (sVar2 == 0) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<short,_unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::NegativeCornerCase(in_DI,in_SI,in_RDX);
    if (!bVar1) {
      uVar3 = (uint)in_DI;
      sVar2 = ::SafeInt::operator_cast_to_short
                        ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT26(in_SI.m_int,
                                     CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)))
      ;
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT26(in_SI.m_int,
                               CONCAT24(in_stack_ffffffffffffffe4,(int)uVar3 / (int)sVar2)),
                   (int *)CONCAT44(in_stack_ffffffffffffffdc,uVar3));
      in_RDX->m_int = in_stack_ffffffffffffffe4;
    }
  }
  else {
    uVar3 = (uint)in_DI;
    ::SafeInt::operator_cast_to_short
              ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT26(in_stack_ffffffffffffffe6,
                           CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT26(in_stack_ffffffffffffffe6,
                             CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
                 (int *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
    in_RDX->m_int = local_12;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }